

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

cmGeneratorExpressionNode * cmGeneratorExpressionNode::GetNode(string *identifier)

{
  int iVar1;
  const_iterator cVar2;
  cmGeneratorExpressionNode *pcVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
  __l;
  allocator_type local_109a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1099;
  ShellPathNode *local_1098;
  DeviceLinkNode *local_1090;
  HostLinkNode *local_1088;
  LinkGroupNode *local_1080;
  LinkLibraryNode *local_1078;
  LinkLanguageNode *local_1070;
  LinkLanguageAndIdNode *local_1068;
  CompileLanguageNode *local_1060;
  CompileLanguageAndIdNode *local_1058;
  LinkOnlyNode *local_1050;
  JoinNode *local_1048;
  InstallPrefixNode *local_1040;
  ZeroNode *local_1038;
  OneNode *local_1030;
  GenexEvalNode *local_1028;
  TargetRuntimeDllsNode *local_1020;
  TargetGenexEvalNode *local_1018;
  TargetNameIfExistsNode *local_1010;
  TargetExistsNode *local_1008;
  TargetPolicyNode *local_1000;
  TargetObjectsNode *local_ff8;
  TargetNameNode *local_ff0;
  TargetPropertyNode *local_fe8;
  CharacterNode<___> *local_fe0;
  CharacterNode<_,_> *local_fd8;
  CharacterNode<_>_> *local_fd0;
  IfNode *local_fc8;
  BoolNode *local_fc0;
  MakeCIdentifierNode *local_fb8;
  PathEqualNode *local_fb0;
  PathNode *local_fa8;
  UpperCaseNode *local_fa0;
  LowerCaseNode *local_f98;
  RemoveDuplicatesNode *local_f90;
  FilterNode *local_f88;
  InListNode *local_f80;
  EqualNode *local_f78;
  StrEqualNode *local_f70;
  TargetFilesystemArtifact<ArtifactBundleContentDirTag,_ArtifactPathTag> *local_f68;
  TargetFilesystemArtifact<ArtifactBundleDirNameTag,_ArtifactNameTag> *local_f60;
  TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag> *local_f58;
  TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag> *local_f50;
  TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactDirTag> *local_f48;
  TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactDirTag> *local_f40;
  TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag> *local_f38;
  TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag> *local_f30;
  TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag> *local_f28;
  TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag> *local_f20;
  TargetFilesystemArtifact<ArtifactNameTag,_ArtifactNameTag> *local_f18;
  TargetFileArtifact<ArtifactLinkerFileSuffixTag> *local_f10;
  TargetFileArtifact<ArtifactFileSuffixTag> *local_f08;
  TargetFileArtifact<ArtifactLinkerFilePrefixTag> *local_f00;
  TargetFileArtifact<ArtifactFilePrefixTag> *local_ef8;
  TargetFileBaseNameArtifact<ArtifactPdbTag> *local_ef0;
  TargetFileBaseNameArtifact<ArtifactLinkerTag> *local_ee8;
  TargetFileBaseNameArtifact<ArtifactNameTag> *local_ee0;
  TargetFilesystemArtifactNodeGroup<ArtifactPdbTag> *local_ed8;
  TargetFilesystemArtifactNodeGroup<ArtifactSonameTag> *local_ed0;
  TargetFilesystemArtifactNodeGroup<ArtifactLinkerTag> *local_ec8;
  TargetFilesystemArtifactNodeGroup<ArtifactNameTag> *local_ec0;
  ConfigurationTestNode *local_eb8;
  ConfigurationNode *local_eb0;
  CompileFeaturesNode *local_ea8;
  PlatformIdNode *local_ea0;
  CompilerVersionNode *local_e98;
  CompilerVersionNode *local_e90;
  CompilerVersionNode *local_e88;
  CompilerVersionNode *local_e80;
  CompilerVersionNode *local_e78;
  CompilerVersionNode *local_e70;
  CompilerVersionNode *local_e68;
  VersionNode<(cmSystemTools::CompareOp)1> *local_e60;
  VersionNode<(cmSystemTools::CompareOp)3> *local_e58;
  VersionNode<(cmSystemTools::CompareOp)2> *local_e50;
  VersionNode<(cmSystemTools::CompareOp)5> *local_e48;
  VersionNode<(cmSystemTools::CompareOp)4> *local_e40;
  CompilerIdNode *local_e38;
  CompilerIdNode *local_e30;
  CompilerIdNode *local_e28;
  CompilerIdNode *local_e20;
  CompilerIdNode *local_e18;
  CompilerIdNode *local_e10;
  CompilerIdNode *local_e08;
  NotNode *local_e00;
  BooleanOpNode *local_df8;
  BooleanOpNode *local_df0;
  OneNode *local_de8;
  ZeroNode *local_de0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_dd8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_db0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_d88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_d60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_d38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_d10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ce8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_cc0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_c98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_c70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_c48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_c20;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_bf8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_bd0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ba8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b30;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b08;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ae0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ab8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a18;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_978;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_950;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_928;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_900;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_8d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_8b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_888;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_860;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_838;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_810;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_798;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_770;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_748;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_720;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_680;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_658;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_630;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_608;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_5e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_5b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_590;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_568;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_540;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_518;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_478;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_450;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_428;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_400;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_3d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_388;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_338;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_310;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_248;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_40;
  
  if (GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    if (iVar1 != 0) {
      local_de0 = &zeroNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[2],_const_ZeroNode_*,_true>
                (&local_dd8,(char (*) [2])0x6ca8b7,&local_de0);
      local_de8 = &oneNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[2],_const_OneNode_*,_true>(&local_db0,(char (*) [2])0x72fe88,&local_de8)
      ;
      local_df0 = &andNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[4],_const_BooleanOpNode_*,_true>
                (&local_d88,(char (*) [4])0x6bf0e4,&local_df0);
      local_df8 = &orNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[3],_const_BooleanOpNode_*,_true>
                (&local_d60,(char (*) [3])0x708c91,&local_df8);
      local_e00 = &notNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[4],_const_NotNode_*,_true>(&local_d38,(char (*) [4])0x6f9781,&local_e00)
      ;
      local_e08 = &cCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_CompilerIdNode_*,_true>
                (&local_d10,(char (*) [14])0x6fbc8b,&local_e08);
      local_e10 = &cxxCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_CompilerIdNode_*,_true>
                (&local_ce8,(char (*) [16])0x6fbc9c,&local_e10);
      local_e18 = &objcCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompilerIdNode_*,_true>
                (&local_cc0,(char (*) [17])"OBJC_COMPILER_ID",&local_e18);
      local_e20 = &objcxxCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_CompilerIdNode_*,_true>
                (&local_c98,(char (*) [19])"OBJCXX_COMPILER_ID",&local_e20);
      local_e28 = &cudaCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompilerIdNode_*,_true>
                (&local_c70,(char (*) [17])0x6d768a,&local_e28);
      local_e30 = &fortranCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_CompilerIdNode_*,_true>
                (&local_c48,(char (*) [20])0x6a9017,&local_e30);
      local_e38 = &hipCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_CompilerIdNode_*,_true>
                (&local_c20,(char (*) [16])"HIP_COMPILER_ID",&local_e38);
      local_e40 = &versionGreaterNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_VersionNode<(cmSystemTools::CompareOp)4>_*,_true>
                (&local_bf8,(char (*) [16])"VERSION_GREATER",&local_e40);
      local_e48 = &versionGreaterEqNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_VersionNode<(cmSystemTools::CompareOp)5>_*,_true>
                (&local_bd0,(char (*) [22])"VERSION_GREATER_EQUAL",&local_e48);
      local_e50 = &versionLessNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[13],_const_VersionNode<(cmSystemTools::CompareOp)2>_*,_true>
                (&local_ba8,(char (*) [13])"VERSION_LESS",&local_e50);
      local_e58 = &versionLessEqNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_VersionNode<(cmSystemTools::CompareOp)3>_*,_true>
                (&local_b80,(char (*) [19])"VERSION_LESS_EQUAL",&local_e58);
      local_e60 = &versionEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_VersionNode<(cmSystemTools::CompareOp)1>_*,_true>
                (&local_b58,(char (*) [14])"VERSION_EQUAL",&local_e60);
      local_e68 = &cCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_CompilerVersionNode_*,_true>
                (&local_b30,(char (*) [19])0x6fbcbf,&local_e68);
      local_e70 = &cxxCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[21],_const_CompilerVersionNode_*,_true>
                (&local_b08,(char (*) [21])0x6fbcd5,&local_e70);
      local_e78 = &cudaCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_CompilerVersionNode_*,_true>
                (&local_ae0,(char (*) [22])0x6ebea6,&local_e78);
      local_e80 = &objcCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_CompilerVersionNode_*,_true>
                (&local_ab8,(char (*) [22])"OBJC_COMPILER_VERSION",&local_e80);
      local_e88 = &objcxxCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[24],_const_CompilerVersionNode_*,_true>
                (&local_a90,(char (*) [24])"OBJCXX_COMPILER_VERSION",&local_e88);
      local_e90 = &fortranCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[25],_const_CompilerVersionNode_*,_true>
                (&local_a68,(char (*) [25])"Fortran_COMPILER_VERSION",&local_e90);
      local_e98 = &hipCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[21],_const_CompilerVersionNode_*,_true>
                (&local_a40,(char (*) [21])"HIP_COMPILER_VERSION",&local_e98);
      local_ea0 = &platformIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_PlatformIdNode_*,_true>
                (&local_a18,(char (*) [12])"PLATFORM_ID",&local_ea0);
      local_ea8 = &compileFeaturesNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompileFeaturesNode_*,_true>
                (&local_9f0,(char (*) [17])0x6e6027,&local_ea8);
      local_eb0 = &configurationNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_ConfigurationNode_*,_true>
                (&local_9c8,(char (*) [14])0x6aecf3,&local_eb0);
      local_eb8 = &configurationTestNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[7],_const_ConfigurationTestNode_*,_true>
                (&local_9a0,(char (*) [7])0x6b9ea2,&local_eb8);
      local_ec0 = &targetNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[12],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactPathTag>_*,_true>
                (&local_978,(char (*) [12])0x6d751d,
                 (TargetFilesystemArtifact<ArtifactNameTag,_ArtifactPathTag> **)&local_ec0);
      local_ec8 = &targetLinkerNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[19],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag>_*,_true>
                (&local_950,(char (*) [19])"TARGET_LINKER_FILE",
                 (TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag> **)&local_ec8);
      local_ed0 = &targetSoNameNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[19],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag>_*,_true>
                (&local_928,(char (*) [19])"TARGET_SONAME_FILE",
                 (TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag> **)&local_ed0);
      local_ed8 = &targetPdbNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[16],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag>_*,_true>
                (&local_900,(char (*) [16])"TARGET_PDB_FILE",
                 (TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag> **)&local_ed8);
      local_ee0 = &targetFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_TargetFileBaseNameArtifact<ArtifactNameTag>_*,_true>
                (&local_8d8,(char (*) [22])"TARGET_FILE_BASE_NAME",&local_ee0);
      local_ee8 = &targetLinkerFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[29],_const_TargetFileBaseNameArtifact<ArtifactLinkerTag>_*,_true>
                (&local_8b0,(char (*) [29])"TARGET_LINKER_FILE_BASE_NAME",&local_ee8);
      local_ef0 = &targetPdbFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileBaseNameArtifact<ArtifactPdbTag>_*,_true>
                (&local_888,(char (*) [26])"TARGET_PDB_FILE_BASE_NAME",&local_ef0);
      local_ef8 = &targetFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_TargetFileArtifact<ArtifactFilePrefixTag>_*,_true>
                (&local_860,(char (*) [19])"TARGET_FILE_PREFIX",&local_ef8);
      local_f00 = &targetLinkerFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactLinkerFilePrefixTag>_*,_true>
                (&local_838,(char (*) [26])"TARGET_LINKER_FILE_PREFIX",&local_f00);
      local_f08 = &targetFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_TargetFileArtifact<ArtifactFileSuffixTag>_*,_true>
                (&local_810,(char (*) [19])"TARGET_FILE_SUFFIX",&local_f08);
      local_f10 = &targetLinkerFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactLinkerFileSuffixTag>_*,_true>
                (&local_7e8,(char (*) [26])"TARGET_LINKER_FILE_SUFFIX",&local_f10);
      local_f18 = &targetNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[17],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactNameTag>_*,_true>
                (&local_7c0,(char (*) [17])"TARGET_FILE_NAME",&local_f18);
      local_f20 = &targetLinkerNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[24],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag>_*,_true>
                (&local_798,(char (*) [24])"TARGET_LINKER_FILE_NAME",&local_f20);
      local_f28 = &targetSoNameNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[24],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag>_*,_true>
                (&local_770,(char (*) [24])"TARGET_SONAME_FILE_NAME",&local_f28);
      local_f30 = &targetPdbNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[21],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag>_*,_true>
                (&local_748,(char (*) [21])"TARGET_PDB_FILE_NAME",&local_f30);
      local_f38 = &targetNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[16],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag>_*,_true>
                (&local_720,(char (*) [16])"TARGET_FILE_DIR",&local_f38);
      local_f40 = &targetLinkerNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactDirTag>_*,_true>
                (&local_6f8,(char (*) [23])"TARGET_LINKER_FILE_DIR",&local_f40);
      local_f48 = &targetSoNameNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactDirTag>_*,_true>
                (&local_6d0,(char (*) [23])"TARGET_SONAME_FILE_DIR",&local_f48);
      local_f50 = &targetPdbNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[20],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag>_*,_true>
                (&local_6a8,(char (*) [20])"TARGET_PDB_FILE_DIR",&local_f50);
      local_f58 = &targetBundleDirNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[18],_const_TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag>_*,_true>
                (&local_680,(char (*) [18])"TARGET_BUNDLE_DIR",&local_f58);
      local_f60 = &targetBundleDirNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactBundleDirNameTag,_ArtifactNameTag>_*,_true>
                (&local_658,(char (*) [23])"TARGET_BUNDLE_DIR_NAME",&local_f60);
      local_f68 = &targetBundleContentDirNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[26],_const_TargetFilesystemArtifact<ArtifactBundleContentDirTag,_ArtifactPathTag>_*,_true>
                (&local_630,(char (*) [26])"TARGET_BUNDLE_CONTENT_DIR",&local_f68);
      local_f70 = &strEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[9],_const_StrEqualNode_*,_true>
                (&local_608,(char (*) [9])"STREQUAL",&local_f70);
      local_f78 = &equalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[6],_const_EqualNode_*,_true>
                (&local_5e0,(char (*) [6])0x6d1bb0,&local_f78);
      local_f80 = &inListNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[8],_const_InListNode_*,_true>
                (&local_5b8,(char (*) [8])"IN_LIST",&local_f80);
      local_f88 = &filterNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[7],_const_FilterNode_*,_true>
                (&local_590,(char (*) [7])"FILTER",&local_f88);
      local_f90 = &removeDuplicatesNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_RemoveDuplicatesNode_*,_true>
                (&local_568,(char (*) [18])"REMOVE_DUPLICATES",&local_f90);
      local_f98 = &lowerCaseNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_LowerCaseNode_*,_true>
                (&local_540,(char (*) [11])"LOWER_CASE",&local_f98);
      local_fa0 = &upperCaseNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_UpperCaseNode_*,_true>
                (&local_518,(char (*) [11])"UPPER_CASE",&local_fa0);
      local_fa8 = &pathNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_PathNode_*,_true>
                (&local_4f0,(char (*) [5])0x6e8f78,&local_fa8);
      local_fb0 = &pathEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_PathEqualNode_*,_true>
                (&local_4c8,(char (*) [11])"PATH_EQUAL",&local_fb0);
      local_fb8 = &makeCIdentifierNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_MakeCIdentifierNode_*,_true>
                (&local_4a0,(char (*) [18])"MAKE_C_IDENTIFIER",&local_fb8);
      local_fc0 = &boolNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_BoolNode_*,_true>
                (&local_478,(char (*) [5])0x6e67db,&local_fc0);
      local_fc8 = &ifNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[3],_const_IfNode_*,_true>(&local_450,(char (*) [3])0x6da098,&local_fc8);
      local_fd0 = &angle_rNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[8],_const_CharacterNode<_>_>____true>
                (&local_428,(char (*) [8])"ANGLE-R",&local_fd0);
      local_fd8 = &commaNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[6],_const_CharacterNode<_,_>_*,_true>
                (&local_400,(char (*) [6])"COMMA",&local_fd8);
      local_fe0 = &semicolonNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_CharacterNode<___>_*,_true>
                (&local_3d8,(char (*) [10])"SEMICOLON",&local_fe0);
      local_fe8 = &targetPropertyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_TargetPropertyNode_*,_true>
                (&local_3b0,(char (*) [16])"TARGET_PROPERTY",&local_fe8);
      local_ff0 = &targetNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_const_TargetNameNode_*,_true>
                (&local_388,(char (*) [12])0x6f43ca,&local_ff0);
      local_ff8 = &targetObjectsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[15],_const_TargetObjectsNode_*,_true>
                (&local_360,(char (*) [15])"TARGET_OBJECTS",&local_ff8);
      local_1000 = &targetPolicyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_TargetPolicyNode_*,_true>
                (&local_338,(char (*) [14])"TARGET_POLICY",&local_1000);
      local_1008 = &targetExistsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_TargetExistsNode_*,_true>
                (&local_310,(char (*) [14])"TARGET_EXISTS",&local_1008);
      local_1010 = &targetNameIfExistsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_TargetNameIfExistsNode_*,_true>
                (&local_2e8,(char (*) [22])"TARGET_NAME_IF_EXISTS",&local_1010);
      local_1018 = &targetGenexEvalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_TargetGenexEvalNode_*,_true>
                (&local_2c0,(char (*) [18])"TARGET_GENEX_EVAL",&local_1018);
      local_1020 = &targetRuntimeDllsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_TargetRuntimeDllsNode_*,_true>
                (&local_298,(char (*) [20])"TARGET_RUNTIME_DLLS",&local_1020);
      local_1028 = &genexEvalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_GenexEvalNode_*,_true>
                (&local_270,(char (*) [11])0x6fbf6c,&local_1028);
      local_1030 = &buildInterfaceNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_OneNode_*,_true>
                (&local_248,(char (*) [16])"BUILD_INTERFACE",&local_1030);
      local_1038 = &installInterfaceNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_ZeroNode_*,_true>
                (&local_220,(char (*) [18])"INSTALL_INTERFACE",&local_1038);
      local_1040 = &installPrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[15],_const_InstallPrefixNode_*,_true>
                (&local_1f8,(char (*) [15])0x6f82fe,&local_1040);
      local_1048 = &joinNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_JoinNode_*,_true>(&local_1d0,(char (*) [5])"JOIN",&local_1048)
      ;
      local_1050 = &linkOnlyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_LinkOnlyNode_*,_true>
                (&local_1a8,(char (*) [10])0x6cd803,&local_1050);
      local_1058 = &languageAndIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_CompileLanguageAndIdNode_*,_true>
                (&local_180,(char (*) [20])"COMPILE_LANG_AND_ID",&local_1058);
      local_1060 = &languageNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompileLanguageNode_*,_true>
                (&local_158,(char (*) [17])"COMPILE_LANGUAGE",&local_1060);
      local_1068 = &linkLanguageAndIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_LinkLanguageAndIdNode_*,_true>
                (&local_130,(char (*) [17])"LINK_LANG_AND_ID",&local_1068);
      local_1070 = &linkLanguageNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_LinkLanguageNode_*,_true>
                (&local_108,(char (*) [14])"LINK_LANGUAGE",&local_1070);
      local_1078 = &linkLibraryNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[13],_const_LinkLibraryNode_*,_true>
                (&local_e0,(char (*) [13])0x6d7404,&local_1078);
      local_1080 = &linkGroupNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_LinkGroupNode_*,_true>
                (&local_b8,(char (*) [11])0x6fcce6,&local_1080);
      local_1088 = &hostLinkNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_HostLinkNode_*,_true>
                (&local_90,(char (*) [10])"HOST_LINK",&local_1088);
      local_1090 = &deviceLinkNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_const_DeviceLinkNode_*,_true>
                (&local_68,(char (*) [12])"DEVICE_LINK",&local_1090);
      local_1098 = &shellPathNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_ShellPathNode_*,_true>
                (&local_40,(char (*) [11])"SHELL_PATH",&local_1098);
      __l._M_len = 0x58;
      __l._M_array = &local_dd8;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
      ::map(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,__l,&local_1099,&local_109a);
      lVar4 = -0xdc0;
      paVar5 = &local_40.first.field_2;
      do {
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar5->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                          paVar5->_M_allocated_capacity + 1);
        }
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar5->_M_allocated_capacity + -5);
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
                   ::~map,&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
          ::find(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t,identifier);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
  {
    pcVar3 = (cmGeneratorExpressionNode *)0x0;
  }
  else {
    pcVar3 = *(cmGeneratorExpressionNode **)(cVar2._M_node + 2);
  }
  return pcVar3;
}

Assistant:

const cmGeneratorExpressionNode* cmGeneratorExpressionNode::GetNode(
  const std::string& identifier)
{
  static std::map<std::string, cmGeneratorExpressionNode const*> const nodeMap{
    { "0", &zeroNode },
    { "1", &oneNode },
    { "AND", &andNode },
    { "OR", &orNode },
    { "NOT", &notNode },
    { "C_COMPILER_ID", &cCompilerIdNode },
    { "CXX_COMPILER_ID", &cxxCompilerIdNode },
    { "OBJC_COMPILER_ID", &objcCompilerIdNode },
    { "OBJCXX_COMPILER_ID", &objcxxCompilerIdNode },
    { "CUDA_COMPILER_ID", &cudaCompilerIdNode },
    { "Fortran_COMPILER_ID", &fortranCompilerIdNode },
    { "HIP_COMPILER_ID", &hipCompilerIdNode },
    { "VERSION_GREATER", &versionGreaterNode },
    { "VERSION_GREATER_EQUAL", &versionGreaterEqNode },
    { "VERSION_LESS", &versionLessNode },
    { "VERSION_LESS_EQUAL", &versionLessEqNode },
    { "VERSION_EQUAL", &versionEqualNode },
    { "C_COMPILER_VERSION", &cCompilerVersionNode },
    { "CXX_COMPILER_VERSION", &cxxCompilerVersionNode },
    { "CUDA_COMPILER_VERSION", &cudaCompilerVersionNode },
    { "OBJC_COMPILER_VERSION", &objcCompilerVersionNode },
    { "OBJCXX_COMPILER_VERSION", &objcxxCompilerVersionNode },
    { "Fortran_COMPILER_VERSION", &fortranCompilerVersionNode },
    { "HIP_COMPILER_VERSION", &hipCompilerVersionNode },
    { "PLATFORM_ID", &platformIdNode },
    { "COMPILE_FEATURES", &compileFeaturesNode },
    { "CONFIGURATION", &configurationNode },
    { "CONFIG", &configurationTestNode },
    { "TARGET_FILE", &targetNodeGroup.File },
    { "TARGET_LINKER_FILE", &targetLinkerNodeGroup.File },
    { "TARGET_SONAME_FILE", &targetSoNameNodeGroup.File },
    { "TARGET_PDB_FILE", &targetPdbNodeGroup.File },
    { "TARGET_FILE_BASE_NAME", &targetFileBaseNameNode },
    { "TARGET_LINKER_FILE_BASE_NAME", &targetLinkerFileBaseNameNode },
    { "TARGET_PDB_FILE_BASE_NAME", &targetPdbFileBaseNameNode },
    { "TARGET_FILE_PREFIX", &targetFilePrefixNode },
    { "TARGET_LINKER_FILE_PREFIX", &targetLinkerFilePrefixNode },
    { "TARGET_FILE_SUFFIX", &targetFileSuffixNode },
    { "TARGET_LINKER_FILE_SUFFIX", &targetLinkerFileSuffixNode },
    { "TARGET_FILE_NAME", &targetNodeGroup.FileName },
    { "TARGET_LINKER_FILE_NAME", &targetLinkerNodeGroup.FileName },
    { "TARGET_SONAME_FILE_NAME", &targetSoNameNodeGroup.FileName },
    { "TARGET_PDB_FILE_NAME", &targetPdbNodeGroup.FileName },
    { "TARGET_FILE_DIR", &targetNodeGroup.FileDir },
    { "TARGET_LINKER_FILE_DIR", &targetLinkerNodeGroup.FileDir },
    { "TARGET_SONAME_FILE_DIR", &targetSoNameNodeGroup.FileDir },
    { "TARGET_PDB_FILE_DIR", &targetPdbNodeGroup.FileDir },
    { "TARGET_BUNDLE_DIR", &targetBundleDirNode },
    { "TARGET_BUNDLE_DIR_NAME", &targetBundleDirNameNode },
    { "TARGET_BUNDLE_CONTENT_DIR", &targetBundleContentDirNode },
    { "STREQUAL", &strEqualNode },
    { "EQUAL", &equalNode },
    { "IN_LIST", &inListNode },
    { "FILTER", &filterNode },
    { "REMOVE_DUPLICATES", &removeDuplicatesNode },
    { "LOWER_CASE", &lowerCaseNode },
    { "UPPER_CASE", &upperCaseNode },
    { "PATH", &pathNode },
    { "PATH_EQUAL", &pathEqualNode },
    { "MAKE_C_IDENTIFIER", &makeCIdentifierNode },
    { "BOOL", &boolNode },
    { "IF", &ifNode },
    { "ANGLE-R", &angle_rNode },
    { "COMMA", &commaNode },
    { "SEMICOLON", &semicolonNode },
    { "TARGET_PROPERTY", &targetPropertyNode },
    { "TARGET_NAME", &targetNameNode },
    { "TARGET_OBJECTS", &targetObjectsNode },
    { "TARGET_POLICY", &targetPolicyNode },
    { "TARGET_EXISTS", &targetExistsNode },
    { "TARGET_NAME_IF_EXISTS", &targetNameIfExistsNode },
    { "TARGET_GENEX_EVAL", &targetGenexEvalNode },
    { "TARGET_RUNTIME_DLLS", &targetRuntimeDllsNode },
    { "GENEX_EVAL", &genexEvalNode },
    { "BUILD_INTERFACE", &buildInterfaceNode },
    { "INSTALL_INTERFACE", &installInterfaceNode },
    { "INSTALL_PREFIX", &installPrefixNode },
    { "JOIN", &joinNode },
    { "LINK_ONLY", &linkOnlyNode },
    { "COMPILE_LANG_AND_ID", &languageAndIdNode },
    { "COMPILE_LANGUAGE", &languageNode },
    { "LINK_LANG_AND_ID", &linkLanguageAndIdNode },
    { "LINK_LANGUAGE", &linkLanguageNode },
    { "LINK_LIBRARY", &linkLibraryNode },
    { "LINK_GROUP", &linkGroupNode },
    { "HOST_LINK", &hostLinkNode },
    { "DEVICE_LINK", &deviceLinkNode },
    { "SHELL_PATH", &shellPathNode }
  };

  {
    auto itr = nodeMap.find(identifier);
    if (itr != nodeMap.end()) {
      return itr->second;
    }
  }
  return nullptr;
}